

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleTypeHandler.cpp
# Opt level: O0

DescriptorFlags __thiscall
Js::SimpleTypeHandler<2UL>::GetSetter
          (SimpleTypeHandler<2UL> *this,DynamicObject *instance,JavascriptString *propertyNameString
          ,Var *setterValue,PropertyValueInfo *info,ScriptContext *requestContext)

{
  code *pcVar1;
  bool bVar2;
  charcount_t cVar3;
  char16 *pcVar4;
  undefined4 *puVar5;
  PropertyRecord *this_00;
  int local_54;
  undefined1 local_50 [4];
  int i;
  CharacterBuffer<char16_t> propertyName;
  ScriptContext *requestContext_local;
  PropertyValueInfo *info_local;
  Var *setterValue_local;
  JavascriptString *propertyNameString_local;
  DynamicObject *instance_local;
  SimpleTypeHandler<2UL> *this_local;
  
  propertyName._8_8_ = requestContext;
  pcVar4 = JavascriptString::GetString(propertyNameString);
  cVar3 = JavascriptString::GetLength(propertyNameString);
  bVar2 = PropertyRecord::IsPropertyNameNumeric(pcVar4,cVar3);
  if (bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleTypeHandler.cpp"
                                ,0x27c,
                                "(!PropertyRecord::IsPropertyNameNumeric(propertyNameString->GetString(), propertyNameString->GetLength()))"
                                ,
                                "Numeric property names should have been converted to uint or PropertyRecord* before calling GetSetter"
                               );
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  pcVar4 = JavascriptString::GetString(propertyNameString);
  cVar3 = JavascriptString::GetLength(propertyNameString);
  JsUtil::CharacterBuffer<char16_t>::CharacterBuffer
            ((CharacterBuffer<char16_t> *)local_50,pcVar4,cVar3);
  local_54 = 0;
  while( true ) {
    if (this->propertyCount <= local_54) {
      return None;
    }
    this_00 = Memory::WriteBarrierPtr<const_Js::PropertyRecord>::operator->
                        (&this->descriptors[local_54].Id);
    bVar2 = PropertyRecord::Equals(this_00,(CharacterBuffer<char16_t> *)local_50);
    if (bVar2) break;
    local_54 = local_54 + 1;
  }
  if ((this->descriptors[local_54].field_1.Attributes & 8) != 0) {
    return None;
  }
  if ((this->descriptors[local_54].field_1.Attributes & 4) == 0) {
    return Data;
  }
  return WritableData;
}

Assistant:

DescriptorFlags SimpleTypeHandler<size>::GetSetter(DynamicObject* instance, JavascriptString* propertyNameString, Var* setterValue, PropertyValueInfo* info, ScriptContext* requestContext)
    {
        AssertMsg(!PropertyRecord::IsPropertyNameNumeric(propertyNameString->GetString(), propertyNameString->GetLength()),
            "Numeric property names should have been converted to uint or PropertyRecord* before calling GetSetter");

        JsUtil::CharacterBuffer<WCHAR> propertyName(propertyNameString->GetString(), propertyNameString->GetLength());
        for (int i = 0; i < propertyCount; i++)
        {
            if (descriptors[i].Id->Equals(propertyName))
            {
                if (descriptors[i].Attributes & PropertyDeleted)
                {
                    return None;
                }
                return (descriptors[i].Attributes & PropertyWritable) ? WritableData : Data;
            }
        }

        return None;
    }